

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LR1.cpp
# Opt level: O0

Node * __thiscall LR::parser(LR *this,string *str)

{
  value_type pNVar1;
  bool bVar2;
  ostream *poVar3;
  size_type sVar4;
  size_type sVar5;
  reference pvVar6;
  reference pvVar7;
  mapped_type *pmVar8;
  Node *pNVar9;
  reference pvVar10;
  ulong uVar11;
  long lVar12;
  mapped_type *__x;
  reference ppNVar13;
  vector<int,_std::allocator<int>_> *this_00;
  undefined1 local_220 [8];
  pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  goto_pair;
  string local_1f0 [32];
  Node *local_1d0;
  Node *father;
  int i_1;
  int i;
  vector<Node_*,_std::allocator<Node_*>_> childs;
  undefined1 local_188 [8];
  string string1;
  undefined1 local_168 [8];
  Prod p_1;
  string local_c8 [32];
  Node *local_a8;
  mapped_type local_9c;
  pair<LR::actionStat,_int> act;
  _Self local_88;
  undefined1 local_80 [8];
  pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> p;
  int iTop;
  int sTop;
  int local_3c;
  undefined1 local_38 [4];
  int step;
  vector<Node_*,_std::allocator<Node_*>_> node_vec;
  bool success;
  string *str_local;
  LR *this_local;
  
  poVar3 = (ostream *)
           std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<(poVar3,"************parse...");
  poVar3 = std::operator<<(poVar3,(string *)str);
  poVar3 = std::operator<<(poVar3,"*************");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  node_vec.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._7_1_ = 0;
  std::vector<Node_*,_std::allocator<Node_*>_>::vector
            ((vector<Node_*,_std::allocator<Node_*>_> *)local_38);
  local_3c = 0;
  do {
    if (((node_vec.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._7_1_ ^ 0xff) & 1) == 0) break;
    poVar3 = std::operator<<((ostream *)&std::cout,"step:");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_3c);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    sVar4 = std::vector<int,_std::allocator<int>_>::size(&this->status);
    sVar5 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&this->inStr);
    p._36_4_ = (int)sVar5 + -1;
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                       (&this->status,(long)((int)sVar4 + -1));
    pvVar7 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&this->inStr,(long)(int)p._36_4_);
    std::make_pair<int&,std::__cxx11::string&>
              ((pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_80,pvVar6,pvVar7);
    local_88._M_node =
         (_Base_ptr)
         std::
         map<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<LR::actionStat,_int>,_std::less<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<LR::actionStat,_int>_>_>_>
         ::find(&this->ACTION,(key_type *)local_80);
    register0x00000000 =
         std::
         map<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<LR::actionStat,_int>,_std::less<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<LR::actionStat,_int>_>_>_>
         ::end(&this->ACTION);
    bVar2 = std::operator==(&local_88,(_Self *)&act.second);
    if (bVar2) {
      act.first = REDUCE|SHIFT;
    }
    else {
      pmVar8 = std::
               map<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<LR::actionStat,_int>,_std::less<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<LR::actionStat,_int>_>_>_>
               ::operator[](&this->ACTION,(key_type *)local_80);
      local_9c = *pmVar8;
      if (local_9c.first == SHIFT) {
        poVar3 = std::operator<<((ostream *)&std::cout,"SHIFT");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        pNVar9 = (Node *)operator_new(0x100);
        p_1.attrs._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 1;
        pvVar7 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](&this->inStr,(long)(int)p._36_4_);
        std::__cxx11::string::string(local_c8,(string *)pvVar7);
        Node::Node(pNVar9,(string *)local_c8);
        p_1.attrs._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 0;
        local_a8 = pNVar9;
        std::vector<Node_*,_std::allocator<Node_*>_>::push_back
                  ((vector<Node_*,_std::allocator<Node_*>_> *)local_38,&local_a8);
        std::__cxx11::string::~string(local_c8);
        std::vector<int,_std::allocator<int>_>::push_back(&this->status,&local_9c.second);
        pvVar7 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](&this->inStr,(long)(int)p._36_4_);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&this->parse,pvVar7);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::pop_back(&this->inStr);
      }
      else if (local_9c.first == REDUCE) {
        pvVar10 = std::vector<Prod,_std::allocator<Prod>_>::operator[]
                            ((vector<Prod,_std::allocator<Prod>_> *)this,(long)local_9c.second);
        Prod::Prod((Prod *)local_168,pvVar10);
        Prod::all_str_abi_cxx11_((Prod *)local_188);
        std::operator+((char *)&childs.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       "REDUCE: ");
        poVar3 = std::operator<<((ostream *)&std::cout,
                                 (string *)
                                 &childs.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl
                                  .super__Vector_impl_data._M_end_of_storage);
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::~string
                  ((string *)
                   &childs.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
        std::vector<Node_*,_std::allocator<Node_*>_>::vector
                  ((vector<Node_*,_std::allocator<Node_*>_> *)&i_1);
        for (father._4_4_ = 0; uVar11 = (ulong)father._4_4_,
            sVar4 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&p_1.field_0x18), uVar11 < sVar4; father._4_4_ = father._4_4_ + 1) {
          lVar12 = (long)father._4_4_;
          sVar4 = std::vector<Node_*,_std::allocator<Node_*>_>::size
                            ((vector<Node_*,_std::allocator<Node_*>_> *)local_38);
          sVar5 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&p_1.field_0x18);
          ppNVar13 = std::vector<Node_*,_std::allocator<Node_*>_>::operator[]
                               ((vector<Node_*,_std::allocator<Node_*>_> *)local_38,
                                (lVar12 + sVar4) - sVar5);
          std::vector<Node_*,_std::allocator<Node_*>_>::push_back
                    ((vector<Node_*,_std::allocator<Node_*>_> *)&i_1,ppNVar13);
        }
        sVar4 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&p_1.field_0x18);
        if (sVar4 != 0) {
          for (father._0_4_ = 0; uVar11 = (ulong)(int)father,
              sVar4 = std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&p_1.field_0x18), uVar11 < sVar4; father._0_4_ = (int)father + 1) {
            std::vector<int,_std::allocator<int>_>::pop_back(&this->status);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::pop_back(&this->parse);
            std::vector<Node_*,_std::allocator<Node_*>_>::pop_back
                      ((vector<Node_*,_std::allocator<Node_*>_> *)local_38);
          }
        }
        pNVar9 = (Node *)operator_new(0x100);
        goto_pair._39_1_ = 1;
        std::__cxx11::string::string(local_1f0,(string *)local_168);
        Node::Node(pNVar9,(string *)local_1f0);
        goto_pair._39_1_ = 0;
        std::__cxx11::string::~string(local_1f0);
        local_1d0 = pNVar9;
        Prod::operator=(&pNVar9->prod,(Prod *)local_168);
        std::vector<Node_*,_std::allocator<Node_*>_>::push_back
                  ((vector<Node_*,_std::allocator<Node_*>_> *)local_38,&local_1d0);
        sVar4 = std::vector<Node_*,_std::allocator<Node_*>_>::size
                          ((vector<Node_*,_std::allocator<Node_*>_> *)local_38);
        ppNVar13 = std::vector<Node_*,_std::allocator<Node_*>_>::operator[]
                             ((vector<Node_*,_std::allocator<Node_*>_> *)local_38,sVar4 - 1);
        std::vector<Node_*,_std::allocator<Node_*>_>::operator=
                  (&(*ppNVar13)->childs,(vector<Node_*,_std::allocator<Node_*>_> *)&i_1);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&this->parse,(value_type *)local_168);
        this_00 = &this->status;
        std::vector<int,_std::allocator<int>_>::size(this_00);
        sVar4 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size(&this->inStr);
        p._36_4_ = (int)sVar4 + -1;
        sVar4 = std::vector<int,_std::allocator<int>_>::size(this_00);
        pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,sVar4 - 1);
        std::make_pair<int&,std::__cxx11::string&>
                  ((pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_220,pvVar6,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_168);
        __x = std::
              map<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_int,_std::less<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_int>_>_>
              ::operator[](&this->GOTO,(key_type *)local_220);
        std::vector<int,_std::allocator<int>_>::push_back(&this->status,__x);
        std::
        pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~pair((pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_220);
        std::vector<Node_*,_std::allocator<Node_*>_>::~vector
                  ((vector<Node_*,_std::allocator<Node_*>_> *)&i_1);
        std::__cxx11::string::~string((string *)local_188);
        Prod::~Prod((Prod *)local_168);
      }
      else if (local_9c.first == ACCEPT) {
        node_vec.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data
        ._M_end_of_storage._7_1_ = 1;
        poVar3 = std::operator<<((ostream *)&std::cout,"Success!");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      }
      local_3c = local_3c + 1;
      act.first = ACCEPT;
    }
    std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair((pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)local_80);
  } while (act.first == ACCEPT);
  if ((node_vec.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage._7_1_ & 1) == 0) {
    poVar3 = std::operator<<((ostream *)&std::cout,"parse error!");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  ppNVar13 = std::vector<Node_*,_std::allocator<Node_*>_>::operator[]
                       ((vector<Node_*,_std::allocator<Node_*>_> *)local_38,0);
  pNVar1 = *ppNVar13;
  act.first = SHIFT;
  std::vector<Node_*,_std::allocator<Node_*>_>::~vector
            ((vector<Node_*,_std::allocator<Node_*>_> *)local_38);
  return pNVar1;
}

Assistant:

Node *LR::parser(string &str) {
    cout << endl << "************parse..." << str << "*************" << endl;

    bool success = false;
    vector<Node *> node_vec;
    int step = 0;
    while (!success) {
        cout << "step:" << step << endl;
        int sTop = status.size() - 1; // 栈顶
        int iTop = inStr.size() - 1;
        pair<int, string> p = make_pair(status[sTop], inStr[iTop]);
        if (ACTION.find(p) == ACTION.end())  // 出错！
            break;
        pair<actionStat, int> act = ACTION[p];
        if (act.first == SHIFT) { // 移进
            cout << "SHIFT" << endl;
            node_vec.push_back(new Node(inStr[iTop]));

            status.push_back(act.second);
            parse.push_back(inStr[iTop]);
            inStr.pop_back();
        } else if (act.first == REDUCE) {
            Prod p = G.prods[act.second];//要规约的表达式
            string string1 = p.all_str();
            cout << "REDUCE: " + string1 << endl;
            vector<Node *> childs;
            for (int i = 0; i < p.right.size(); i++) {
                childs.push_back(node_vec[i + node_vec.size() - p.right.size()]);
            }


            if (p.right.size() != 0) { // 空串，无需出栈，直接规约
                for (int i = 0; i < p.right.size(); i++) {
                    status.pop_back();
                    parse.pop_back();
                    node_vec.pop_back();
                }
            }
            Node *father = new Node(p.noTerminal);
            father->prod = p;
            node_vec.push_back(father);
            node_vec[node_vec.size() - 1]->childs = childs;


            parse.push_back(p.noTerminal);
            sTop = status.size() - 1; // 栈顶
            iTop = inStr.size() - 1;
            pair<int, string> goto_pair =
                    make_pair(status[status.size() - 1], p.noTerminal);
            status.push_back(GOTO[goto_pair]);
        } else if (act.first == ACCEPT) {
            success = true;
            cout << "Success!" << endl;
        }
        step++;
    }
    if (!success) {
        cout << "parse error!" << endl;
    }
    return node_vec[0];
}